

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O2

PBuffer __thiscall DataSourceAmiga::get_sound(DataSourceAmiga *this,size_t index)

{
  Stream *pSVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PBuffer PVar2;
  PBuffer data;
  ConvertorSFX2WAV convertor;
  allocator<char> local_b9;
  unsigned_long local_b8;
  undefined1 local_b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ConvertorSFX2WAV local_90;
  string local_30 [32];
  
  get_sound_data((DataSourceAmiga *)local_b0,index);
  if ((_func_int **)local_b0._0_8_ == (_func_int **)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"data",&local_b9);
    Log::Logger::operator[]((Logger *)&local_90,(string *)&Log::Error);
    pSVar1 = Log::Stream::operator<<((Stream *)&local_90,"Sound sample with index");
    pSVar1 = Log::Stream::operator<<(pSVar1,&local_b8);
    Log::Stream::operator<<(pSVar1," not present.");
    Log::Stream::~Stream((Stream *)&local_90);
    std::__cxx11::string::~string(local_30);
    (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
         (_func_int **)0x0;
    (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    std::__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 0x10),
               (__shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
    ConvertorSFX2WAV::ConvertorSFX2WAV(&local_90,(PBuffer *)(local_b0 + 0x10),0,false);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    ConvertorPCM2WAV::convert((ConvertorPCM2WAV *)this);
    ConvertorPCM2WAV::~ConvertorPCM2WAV(&local_90.super_ConvertorPCM2WAV);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PBuffer)PVar2.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PBuffer
DataSourceAmiga::get_sound(size_t index) {
  PBuffer data = get_sound_data(index);
  if (!data) {
    Log::Error["data"] << "Sound sample with index" << index << " not present.";
    return nullptr;
  }

  try {
    ConvertorSFX2WAV convertor(data);
    return convertor.convert();
  } catch (...) {
    Log::Error["data"] << "Could not convert SFX clip to WAV: #" << index;
    return nullptr;
  }
}